

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureMultisampleTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::MultisampleTextureUsageCase::init
          (MultisampleTextureUsageCase *this,EVP_PKEY_CTX *ctx)

{
  GLuint *pGVar1;
  ostringstream *poVar2;
  bool bVar3;
  TestLog *pTVar4;
  Context *pCVar5;
  RenderContext *pRVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ContextType CVar10;
  deUint32 dVar11;
  GLSLVersion GVar12;
  int extraout_EAX;
  undefined4 extraout_var;
  RenderTarget *pRVar14;
  mapped_type *pmVar15;
  ShaderProgram *pSVar16;
  ProgramSources *pPVar17;
  TestError *pTVar18;
  NotSupportedError *pNVar19;
  string *psVar20;
  uint *puVar21;
  int iVar22;
  bool *pbVar23;
  _Rb_tree_color _Var24;
  char *__s;
  bool *pbVar25;
  allocator<char> local_2c1;
  GLint maxSamples;
  string local_2b8 [32];
  GLint maxTextureSize;
  undefined1 local_290 [24];
  _Base_ptr local_278;
  size_t local_270;
  ScopedLogSection section;
  string local_258;
  undefined1 local_238 [40];
  undefined1 local_210 [184];
  undefined1 uStack_158;
  undefined7 uStack_157;
  undefined1 uStack_150;
  undefined8 uStack_14f;
  StringTemplate local_90;
  string local_70;
  string local_50;
  long lVar13;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar9);
  _Var24 = 0x8229;
  if ((((this->m_isColorFormat == false) && (_Var24 = 0x8231, this->m_isSignedFormat == false)) &&
      (_Var24 = 0x8232, this->m_isUnsignedFormat == false)) &&
     (_Var24 = 0x8cac, this->m_isDepthFormat == false)) {
    _Var24 = _S_red;
  }
  bVar8 = this->m_isArrayType;
  bVar3 = this->m_isDepthFormat;
  CVar10.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar7 = glu::contextSupports(CVar10,(ApiType)0x23);
  if (((!bVar7) && (this->m_isArrayType != false)) &&
     (bVar7 = glu::ContextInfo::isExtensionSupported
                        (((this->super_TestCase).m_context)->m_contextInfo,
                         "GL_OES_texture_storage_multisample_2d_array"), !bVar7)) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,
               "Test requires OES_texture_storage_multisample_2d_array extension",
               (allocator<char> *)&maxTextureSize);
    tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)local_210);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar14 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((pRVar14->m_width < 0x100) ||
     (pRVar14 = Context::getRenderTarget((this->super_TestCase).m_context),
     pRVar14->m_height < 0x100)) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_70._M_dataplus._M_p._0_4_ = 0x100;
    de::toString<int>((string *)local_238,(int *)&local_70);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&maxSamples,
                   "render target size must be at least ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &maxTextureSize,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&maxSamples,
                   "x");
    local_90.m_template._M_dataplus._M_p._0_4_ = 0x100;
    de::toString<int>(&local_258,(int *)&local_90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &maxTextureSize,&local_258);
    tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)local_210);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar9 = (uint)bVar8 * 2 + 0x9100;
  maxSamples = 0;
  (**(code **)(lVar13 + 0x880))(iVar9,_Var24,0x80a9,1,&maxSamples);
  if (maxSamples < this->m_numSamples) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"Requested sample count is greater than supported",
               (allocator<char> *)&maxTextureSize);
    tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)local_210);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_210._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_210 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Max sample count for ");
  _maxTextureSize = glu::getTextureFormatName;
  local_290._0_4_ = _Var24;
  tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)&maxTextureSize,(ostream *)poVar2);
  std::operator<<((ostream *)poVar2,": ");
  std::ostream::operator<<(poVar2,maxSamples);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_210,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  _maxTextureSize = (code *)((ulong)_maxTextureSize & 0xffffffff00000000);
  (**(code **)(lVar13 + 0x868))(0xd33,&maxTextureSize);
  if (maxTextureSize < 0x100) {
    pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"Larger GL_MAX_TEXTURE_SIZE is required",
               (allocator<char> *)&maxSamples);
    tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)local_210);
    __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_isArrayType == true) {
    _maxTextureSize = (code *)((ulong)_maxTextureSize & 0xffffffff00000000);
    (**(code **)(lVar13 + 0x868))(0x88ff,&maxTextureSize);
    if (maxTextureSize < 8) {
      pNVar19 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_210,"Larger GL_MAX_ARRAY_TEXTURE_LAYERS is required",
                 (allocator<char> *)&maxSamples);
      tcu::NotSupportedError::NotSupportedError(pNVar19,(string *)local_210);
      __cxa_throw(pNVar19,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_210._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar2 = (ostringstream *)(local_210 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar2);
  std::operator<<((ostream *)poVar2,"Creating multisample ");
  pbVar23 = (bool *)0x89480a;
  pbVar25 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (this->m_isDepthFormat == false) {
    pbVar23 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::operator<<((ostream *)poVar2,pbVar23);
  std::operator<<((ostream *)poVar2," texture");
  if (this->m_isArrayType != false) {
    pbVar25 = (bool *)0x7f6cb7;
  }
  std::operator<<((ostream *)poVar2,pbVar25);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_210,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar2);
  pGVar1 = &this->m_textureID;
  (**(code **)(lVar13 + 0x6f8))(1,pGVar1);
  (**(code **)(lVar13 + 0xb8))(iVar9,this->m_textureID);
  dVar11 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar11,"bind texture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x492);
  if (this->m_isArrayType == true) {
    (**(code **)(lVar13 + 0x13a8))(0x9102,this->m_numSamples,_Var24,0x100,0x100,8,0);
  }
  else {
    (**(code **)(lVar13 + 0x1390))(0x9100,this->m_numSamples,_Var24,0x100,0x100,0);
  }
  iVar22 = (uint)bVar3 * 0x20 + 0x8ce0;
  dVar11 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar11,"texstorage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x498);
  (**(code **)(lVar13 + 0x6d0))(1,&this->m_fboID);
  (**(code **)(lVar13 + 0x78))(0x8d40,this->m_fboID);
  if (this->m_isArrayType == true) {
    local_210._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_210 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Attaching multisample texture array layer ");
    std::ostream::operator<<(poVar2,3);
    std::operator<<((ostream *)poVar2," to fbo");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_210,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    (**(code **)(lVar13 + 0x6b8))(0x8d40,iVar22,*pGVar1,0,3);
  }
  else {
    local_210._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_210 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"Attaching multisample texture to fbo");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_210,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    (**(code **)(lVar13 + 0x6a0))(0x8d40,iVar22,iVar9,*pGVar1,0);
  }
  dVar11 = (**(code **)(lVar13 + 0x800))();
  glu::checkError(dVar11,"gen fbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureMultisampleTests.cpp"
                  ,0x4a9);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_210,"RenderShader",(allocator<char> *)&maxSamples);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&maxTextureSize,"Generate render-to-texture shader",
             (allocator<char> *)local_238);
  psVar20 = (string *)&maxTextureSize;
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,(string *)local_210,psVar20);
  std::__cxx11::string::~string((string *)&maxTextureSize);
  std::__cxx11::string::~string((string *)local_210);
  __s = 
  "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp ${OUTTYPE} fragColor;\nuniform highp float u_writeValue;\nvoid main (void)\n{\n\tfragColor = ${OUTTYPE}(vec4(u_writeValue, 1.0, 1.0, 1.0));\n}\n"
  ;
  if (this->m_isDepthFormat != false) {
    __s = 
    "${GLSL_VERSION_DECL}\nlayout(location = 0) out highp vec4 fragColor;\nuniform highp float u_writeValue;\nvoid main (void)\n{\n\tfragColor = vec4(0.0, 0.0, 0.0, 1.0);\n\tgl_FragDepth = u_writeValue;\n}\n"
    ;
  }
  local_290._16_8_ = local_290;
  local_290._0_4_ = _S_red;
  local_290._8_8_ = 0;
  local_270 = 0;
  local_278 = (_Base_ptr)local_290._16_8_;
  CVar10.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  GVar12 = glu::getContextTypeGLSLVersion(CVar10);
  glu::getGLSLVersionDeclaration(GVar12);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_210,"GLSL_VERSION_DECL",(allocator<char> *)&maxSamples);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&maxTextureSize,(key_type *)local_210);
  std::__cxx11::string::assign((char *)pmVar15);
  std::__cxx11::string::~string((string *)local_210);
  if ((this->m_isColorFormat == false) && (this->m_isDepthFormat != true)) {
    if (this->m_isSignedFormat == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_210,"OUTTYPE",(allocator<char> *)&maxSamples);
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&maxTextureSize,(key_type *)local_210);
      std::__cxx11::string::assign((char *)pmVar15);
      goto LAB_004d2aad;
    }
    if (this->m_isUnsignedFormat == true) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_210,"OUTTYPE",(allocator<char> *)&maxSamples);
      pmVar15 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)&maxTextureSize,(key_type *)local_210);
      std::__cxx11::string::assign((char *)pmVar15);
      goto LAB_004d2aad;
    }
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"OUTTYPE",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
LAB_004d2aad:
    std::__cxx11::string::~string((string *)local_210);
  }
  pSVar16 = (ShaderProgram *)operator_new(0xd0);
  pCVar5 = (this->super_TestCase).m_context;
  pRVar6 = pCVar5->m_renderCtx;
  memset(local_210,0,0xac);
  local_210._176_8_ = (pointer)0x0;
  uStack_158 = 0;
  uStack_157 = 0;
  uStack_150 = 0;
  uStack_14f = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_258,(_anonymous_namespace_ *)pCVar5,
             (Context *)
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,(char *)psVar20);
  glu::VertexSource::VertexSource((VertexSource *)&maxSamples,&local_258);
  pPVar17 = glu::ProgramSources::operator<<((ProgramSources *)local_210,(ShaderSource *)&maxSamples)
  ;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_2c1);
  tcu::StringTemplate::StringTemplate(&local_90,&local_50);
  tcu::StringTemplate::specialize
            (&local_70,&local_90,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&maxTextureSize);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_238,&local_70);
  pPVar17 = glu::ProgramSources::operator<<(pPVar17,(ShaderSource *)local_238);
  glu::ShaderProgram::ShaderProgram(pSVar16,pRVar6,pPVar17);
  this->m_drawShader = pSVar16;
  std::__cxx11::string::~string((string *)(local_238 + 8));
  std::__cxx11::string::~string((string *)&local_70);
  tcu::StringTemplate::~StringTemplate(&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string((string *)&local_258);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_210);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_drawShader);
  if ((this->m_drawShader->m_program).m_info.linkOk == false) {
    pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"could not build shader",(allocator<char> *)&maxSamples);
    tcu::TestError::TestError(pTVar18,(string *)local_210);
    __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&maxTextureSize);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_210,"SamplerShader",(allocator<char> *)&maxSamples);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&maxTextureSize,"Generate texture sampler shader",
             (allocator<char> *)local_238);
  psVar20 = (string *)&maxTextureSize;
  tcu::ScopedLogSection::ScopedLogSection(&section,pTVar4,(string *)local_210,psVar20);
  std::__cxx11::string::~string((string *)&maxTextureSize);
  std::__cxx11::string::~string((string *)local_210);
  local_290._0_4_ = _S_red;
  local_290._8_8_ = 0;
  local_290._16_8_ = local_290;
  local_270 = 0;
  local_278 = (_Base_ptr)local_290._16_8_;
  CVar10.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  GVar12 = glu::getContextTypeGLSLVersion(CVar10);
  glu::getGLSLVersionDeclaration(GVar12);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_210,"GLSL_VERSION_DECL",(allocator<char> *)&maxSamples);
  pmVar15 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&maxTextureSize,(key_type *)local_210);
  std::__cxx11::string::assign((char *)pmVar15);
  std::__cxx11::string::~string((string *)local_210);
  if (this->m_isArrayType == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"FETCHPOS",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"FETCHPOS",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
  }
  std::__cxx11::string::~string((string *)local_210);
  if ((this->m_isColorFormat == false) && (this->m_isDepthFormat != true)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"EPSILON",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"EPSILON",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
  }
  std::__cxx11::string::~string((string *)local_210);
  if (this->m_isArrayType == true) {
    CVar10.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar8 = glu::contextSupports(CVar10,(ApiType)0x23);
    if (bVar8) goto LAB_004d2ecc;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"EXTENSION_STATEMENT",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
  }
  else {
LAB_004d2ecc:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"EXTENSION_STATEMENT",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
  }
  std::__cxx11::string::~string((string *)local_210);
  puVar21 = &switchD_004d2f6a::switchdataD_00827340;
  switch(this->m_type) {
  case TEXTURE_COLOR_2D:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"SAMPLERTYPE",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
    psVar20 = (string *)puVar21;
    break;
  case TEXTURE_COLOR_2D_ARRAY:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"SAMPLERTYPE",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
    psVar20 = (string *)puVar21;
    break;
  case TEXTURE_INT_2D:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"SAMPLERTYPE",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
    psVar20 = (string *)puVar21;
    break;
  case TEXTURE_INT_2D_ARRAY:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"SAMPLERTYPE",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
    psVar20 = (string *)puVar21;
    break;
  case TEXTURE_UINT_2D:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"SAMPLERTYPE",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
    psVar20 = (string *)puVar21;
    break;
  case TEXTURE_UINT_2D_ARRAY:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"SAMPLERTYPE",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
    psVar20 = (string *)puVar21;
    break;
  case TEXTURE_DEPTH_2D:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"SAMPLERTYPE",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
    psVar20 = (string *)puVar21;
    break;
  case TEXTURE_DEPTH_2D_ARRAY:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"SAMPLERTYPE",(allocator<char> *)&maxSamples);
    pmVar15 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)&maxTextureSize,(key_type *)local_210);
    std::__cxx11::string::assign((char *)pmVar15);
    psVar20 = (string *)puVar21;
    break;
  default:
    goto switchD_004d2f6a_default;
  }
  std::__cxx11::string::~string((string *)local_210);
switchD_004d2f6a_default:
  pSVar16 = (ShaderProgram *)operator_new(0xd0);
  pCVar5 = (this->super_TestCase).m_context;
  pRVar6 = pCVar5->m_renderCtx;
  memset(local_210,0,0xac);
  local_210._176_8_ = (pointer)0x0;
  uStack_158 = 0;
  uStack_157 = 0;
  uStack_150 = 0;
  uStack_14f = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_258,(_anonymous_namespace_ *)pCVar5,
             (Context *)
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp float v_gradient;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_gradient = a_position.x * 0.5 + 0.5;\n}\n"
             ,(char *)psVar20);
  glu::VertexSource::VertexSource((VertexSource *)&maxSamples,&local_258);
  pPVar17 = glu::ProgramSources::operator<<((ProgramSources *)local_210,(ShaderSource *)&maxSamples)
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,
             "${GLSL_VERSION_DECL}\n${EXTENSION_STATEMENT}layout(location = 0) out highp vec4 fragColor;\nuniform highp ${SAMPLERTYPE} u_sampler;\nuniform highp int u_maxSamples;\nuniform highp int u_layer;\nuniform highp float u_cmpValue;\nin highp float v_gradient;\nvoid main (void)\n{\n\tconst highp vec4 okColor = vec4(0.0, 1.0, 0.0, 1.0);\n\tconst highp vec4 failColor = vec4(1.0, 0.0, 0.0, 1.0);\n\tconst highp float epsilon = ${EPSILON};\n\n\thighp int sampleNdx = clamp(int(floor(v_gradient * float(u_maxSamples))), 0, u_maxSamples-1);\n\thighp float value = float(texelFetch(u_sampler, ${FETCHPOS}, sampleNdx).r);\n\tfragColor = (abs(u_cmpValue - value) < epsilon) ? (okColor) : (failColor);\n}\n"
             ,&local_2c1);
  tcu::StringTemplate::StringTemplate(&local_90,&local_50);
  tcu::StringTemplate::specialize
            (&local_70,&local_90,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&maxTextureSize);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_238,&local_70);
  pPVar17 = glu::ProgramSources::operator<<(pPVar17,(ShaderSource *)local_238);
  glu::ShaderProgram::ShaderProgram(pSVar16,pRVar6,pPVar17);
  this->m_samplerShader = pSVar16;
  std::__cxx11::string::~string((string *)(local_238 + 8));
  std::__cxx11::string::~string((string *)&local_70);
  tcu::StringTemplate::~StringTemplate(&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_2b8);
  std::__cxx11::string::~string((string *)&local_258);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_210);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_samplerShader);
  if ((this->m_samplerShader->m_program).m_info.linkOk == false) {
    pTVar18 = (TestError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_210,"could not build shader",(allocator<char> *)&maxSamples);
    tcu::TestError::TestError(pTVar18,(string *)local_210);
    __cxa_throw(pTVar18,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&maxTextureSize);
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  return extraout_EAX;
}

Assistant:

void MultisampleTextureUsageCase::init (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const glw::GLenum		internalFormat	= (m_isColorFormat) ? (GL_R8) : (m_isSignedFormat) ? (GL_R8I) : (m_isUnsignedFormat) ? (GL_R8UI) : (m_isDepthFormat) ? (GL_DEPTH_COMPONENT32F) : (0);
	const glw::GLenum		textureTarget	= (m_isArrayType) ? (GL_TEXTURE_2D_MULTISAMPLE_ARRAY) : (GL_TEXTURE_2D_MULTISAMPLE);
	const glw::GLenum		fboAttachment	= (m_isDepthFormat) ? (GL_DEPTH_ATTACHMENT) : (GL_COLOR_ATTACHMENT0);
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	DE_ASSERT(internalFormat);

	// requirements

	if (m_isArrayType && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_texture_storage_multisample_2d_array"))
		throw tcu::NotSupportedError("Test requires OES_texture_storage_multisample_2d_array extension");
	if (m_context.getRenderTarget().getWidth() < s_textureSize || m_context.getRenderTarget().getHeight() < s_textureSize)
		throw tcu::NotSupportedError("render target size must be at least " + de::toString(static_cast<int>(s_textureSize)) + "x" + de::toString(static_cast<int>(s_textureSize)));

	{
		glw::GLint maxSamples = 0;
		gl.getInternalformativ(textureTarget, internalFormat, GL_SAMPLES, 1, &maxSamples);

		if (m_numSamples > maxSamples)
			throw tcu::NotSupportedError("Requested sample count is greater than supported");

		m_testCtx.getLog() << tcu::TestLog::Message << "Max sample count for " << glu::getTextureFormatStr(internalFormat) << ": " << maxSamples << tcu::TestLog::EndMessage;
	}

	{
		GLint maxTextureSize = 0;
		gl.getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);

		if (s_textureSize > maxTextureSize)
			throw tcu::NotSupportedError("Larger GL_MAX_TEXTURE_SIZE is required");
	}

	if (m_isArrayType)
	{
		GLint maxTextureLayers = 0;
		gl.getIntegerv(GL_MAX_ARRAY_TEXTURE_LAYERS, &maxTextureLayers);

		if (s_textureArraySize > maxTextureLayers)
			throw tcu::NotSupportedError("Larger GL_MAX_ARRAY_TEXTURE_LAYERS is required");
	}

	// create texture

	m_testCtx.getLog() << tcu::TestLog::Message << "Creating multisample " << ((m_isDepthFormat) ? ("depth") : ("")) << " texture" << ((m_isArrayType) ? (" array") : ("")) << tcu::TestLog::EndMessage;

	gl.genTextures(1, &m_textureID);
	gl.bindTexture(textureTarget, m_textureID);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind texture");

	if (m_isArrayType)
		gl.texStorage3DMultisample(GL_TEXTURE_2D_MULTISAMPLE_ARRAY, m_numSamples, internalFormat, s_textureSize, s_textureSize, s_textureArraySize, GL_FALSE);
	else
		gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, m_numSamples, internalFormat, s_textureSize, s_textureSize, GL_FALSE);
	GLU_EXPECT_NO_ERROR(gl.getError(), "texstorage");

	// create fbo for drawing

	gl.genFramebuffers(1, &m_fboID);
	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fboID);

	if (m_isArrayType)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Attaching multisample texture array layer " << static_cast<int>(s_textureLayer) << " to fbo" << tcu::TestLog::EndMessage;
		gl.framebufferTextureLayer(GL_FRAMEBUFFER, fboAttachment, m_textureID, 0, s_textureLayer);
	}
	else
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Attaching multisample texture to fbo" << tcu::TestLog::EndMessage;
		gl.framebufferTexture2D(GL_FRAMEBUFFER, fboAttachment, textureTarget, m_textureID, 0);
	}
	GLU_EXPECT_NO_ERROR(gl.getError(), "gen fbo");

	// create shader for rendering to fbo
	genDrawShader();

	// create shader for sampling the texture rendered to
	genSamplerShader();
}